

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

OPJ_SIZE_T opj_tcd_get_encoded_tile_size(opj_tcd_t *p_tcd)

{
  OPJ_SIZE_T OVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 *pOVar3;
  OPJ_INT32 *pOVar4;
  uint uVar5;
  
  OVar2 = p_tcd->image->numcomps;
  if (OVar2 != 0) {
    pOVar4 = &p_tcd->tcd_image->tiles->comps->y1;
    pOVar3 = &p_tcd->image->comps->prec;
    OVar1 = 0;
    do {
      uVar5 = ((*pOVar3 >> 3) + 1) - (uint)((*pOVar3 & 7) == 0);
      if (uVar5 == 3) {
        uVar5 = 4;
      }
      OVar1 = OVar1 + ((long)*pOVar4 - (long)pOVar4[-2]) *
                      ((long)pOVar4[-1] - (long)((opj_tcd_tilecomp_t *)(pOVar4 + -3))->x0) *
                      (ulong)uVar5;
      pOVar4 = pOVar4 + 0x1c;
      pOVar3 = pOVar3 + 0x10;
      OVar2 = OVar2 - 1;
    } while (OVar2 != 0);
    return OVar1;
  }
  return 0;
}

Assistant:

OPJ_SIZE_T opj_tcd_get_encoded_tile_size(opj_tcd_t *p_tcd)
{
    OPJ_UINT32 i;
    OPJ_SIZE_T l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tilec = 00;
    OPJ_UINT32 l_size_comp, l_remaining;

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;
    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        l_data_size += l_size_comp * ((OPJ_SIZE_T)(l_tilec->x1 - l_tilec->x0) *
                                      (OPJ_SIZE_T)(l_tilec->y1 - l_tilec->y0));
        ++l_img_comp;
        ++l_tilec;
    }

    return l_data_size;
}